

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O1

UBool __thiscall
icu_63::ReorderingBuffer::appendZeroCC
          (ReorderingBuffer *this,UChar *s,UChar *sLimit,UErrorCode *errorCode)

{
  UChar *pUVar1;
  UBool UVar2;
  int appendLength;
  
  if (s != sLimit) {
    appendLength = (int)((ulong)((long)sLimit - (long)s) >> 1);
    if ((this->remainingCapacity < appendLength) &&
       (UVar2 = resize(this,appendLength,errorCode), UVar2 == '\0')) {
      return '\0';
    }
    u_memcpy_63(this->limit,s,appendLength);
    pUVar1 = this->limit;
    this->limit = pUVar1 + appendLength;
    this->remainingCapacity = this->remainingCapacity - appendLength;
    this->lastCC = '\0';
    this->reorderStart = pUVar1 + appendLength;
  }
  return '\x01';
}

Assistant:

UBool ReorderingBuffer::appendZeroCC(const UChar *s, const UChar *sLimit, UErrorCode &errorCode) {
    if(s==sLimit) {
        return TRUE;
    }
    int32_t length=(int32_t)(sLimit-s);
    if(remainingCapacity<length && !resize(length, errorCode)) {
        return FALSE;
    }
    u_memcpy(limit, s, length);
    limit+=length;
    remainingCapacity-=length;
    lastCC=0;
    reorderStart=limit;
    return TRUE;
}